

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

bool __thiscall World::PlayerOnline(World *this,string *username)

{
  bool bVar1;
  int iVar2;
  list<Client_*,_std::allocator<Client_*>_> *this_00;
  reference ppCVar3;
  EOClient *eoclient;
  Client *client;
  iterator __end1;
  iterator __begin1;
  list<Client_*,_std::allocator<Client_*>_> *__range1;
  string local_40;
  string *local_20;
  string *username_local;
  World *this_local;
  
  local_20 = username;
  username_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)username);
  bVar1 = Player::ValidName(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_00 = &(this->server->super_Server).clients;
    __end1 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::begin(this_00);
    client = (Client *)std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::end(this_00);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&client), bVar1) {
      ppCVar3 = std::_List_iterator<Client_*>::operator*(&__end1);
      if ((*(long *)&(*ppCVar3)[1].send_buffer != 0) &&
         (iVar2 = std::__cxx11::string::compare
                            ((string *)(*(long *)&(*ppCVar3)[1].send_buffer + 0x10)), iVar2 == 0)) {
        return true;
      }
      std::_List_iterator<Client_*>::operator++(&__end1);
    }
  }
  return false;
}

Assistant:

bool World::PlayerOnline(std::string username)
{
	if (!Player::ValidName(username))
	{
		return false;
	}

	UTIL_FOREACH(this->server->clients, client)
	{
		EOClient *eoclient = static_cast<EOClient *>(client);

		if (eoclient->player)
		{
			if (eoclient->player->username.compare(username) == 0)
			{
				return true;
			}
		}
	}

	return false;
}